

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_tree_clusterizer.h
# Opt level: O2

void crnlib::split_vectors<crnlib::vec<1u,float>>
               (vec<1U,_float> (*vectors) [64],uint (*weights) [64],uint size,
               vec<1U,_float> (*result) [2])

{
  double dVar1;
  float fVar2;
  uint i;
  int iVar3;
  ulong uVar4;
  ulong uVar5;
  uint i_3;
  ulong uVar6;
  ulong uVar7;
  bool bVar8;
  uint uVar9;
  float fVar10;
  undefined8 uVar11;
  float fVar12;
  undefined1 auVar13 [16];
  float in_XMM3_Da;
  float fVar14;
  float in_XMM3_Db;
  float fVar15;
  float fVar16;
  double dVar17;
  float in_XMM12_Da;
  float in_XMM12_Db;
  vec<1U,_float> local_35c;
  undefined1 local_358 [16];
  float local_348;
  float fStack_344;
  float fStack_340;
  float fStack_33c;
  vec<1U,_float> weightedVectors [64];
  double weightedDotProducts [64];
  
  uVar7 = (ulong)size;
  dVar1 = 0.0;
  fVar12 = 0.0;
  uVar4 = 0;
  for (uVar5 = 0; uVar7 != uVar5; uVar5 = uVar5 + 1) {
    uVar9 = (*weights)[uVar5];
    fVar10 = (float)uVar9;
    fVar14 = (*vectors)[uVar5].m_s[0];
    fVar15 = fVar14 * fVar10;
    weightedVectors[uVar5].m_s[0] = fVar15;
    fVar12 = fVar12 + fVar15;
    uVar4 = uVar4 + uVar9;
    in_XMM3_Da = fVar14 * fVar14 * fVar10;
    in_XMM3_Db = 0.0;
    weightedDotProducts[uVar5] = (double)in_XMM3_Da;
    dVar1 = dVar1 + (double)in_XMM3_Da;
  }
  fVar14 = (float)uVar4;
  fVar10 = (1.0 / fVar14) * fVar12;
  (*result)[1].m_s[0] = fVar10;
  (*result)[0].m_s[0] = fVar10;
  if ((size != 1) && (0.0 < (float)(dVar1 - (double)((fVar12 * fVar12) / fVar14)))) {
    fVar12 = -1.0;
    for (uVar4 = 0; uVar7 != uVar4; uVar4 = uVar4 + 1) {
      fVar15 = (*vectors)[uVar4].m_s[0];
      fVar16 = fVar15 - fVar10;
      fVar16 = fVar16 * fVar16 + 0.0;
      fVar2 = 0.0;
      if (fVar16 <= fVar12) {
        fVar16 = fVar12;
        fVar2 = in_XMM12_Db;
        fVar15 = in_XMM12_Da;
      }
      in_XMM12_Da = fVar15;
      in_XMM12_Db = fVar2;
      fVar12 = fVar16;
      in_XMM3_Da = in_XMM12_Da;
      in_XMM3_Db = in_XMM12_Db;
    }
    fVar12 = -1.0;
    for (uVar4 = 0; uVar7 != uVar4; uVar4 = uVar4 + 1) {
      fVar15 = (*vectors)[uVar4].m_s[0];
      fVar16 = fVar15 - in_XMM12_Da;
      fVar16 = fVar16 * fVar16 + 0.0;
      fVar2 = 0.0;
      if (fVar16 <= fVar12) {
        fVar16 = fVar12;
        fVar2 = in_XMM3_Db;
        fVar15 = in_XMM3_Da;
      }
      in_XMM3_Da = fVar15;
      in_XMM3_Db = fVar2;
      fVar12 = fVar16;
    }
    local_348 = (in_XMM12_Da + fVar10) * 0.5;
    fStack_344 = (in_XMM3_Da + fVar10) * 0.5;
    fStack_340 = (in_XMM12_Db + fVar10) * 0.0;
    fStack_33c = (in_XMM3_Db + fVar10) * 0.0;
    if (2 < size) {
      fVar12 = 0.0;
      for (uVar4 = 0; uVar7 != uVar4; uVar4 = uVar4 + 1) {
        fVar15 = (*vectors)[uVar4].m_s[0] - fVar10;
        fVar12 = fVar12 + (float)(*weights)[uVar4] * fVar15 * fVar15;
      }
      iVar3 = 10;
      local_35c.m_s[0] = (float  [1])1.0;
      while (bVar8 = iVar3 != 0, iVar3 = iVar3 + -1, bVar8) {
        fVar16 = (float)local_35c.m_s[0] * (fVar12 / fVar14);
        fVar15 = fVar16 + 0.0;
        uVar9 = -(uint)(fVar16 != 0.0);
        local_35c.m_s[0] =
             (float  [1])(uVar9 & (uint)((1.0 / fVar15) * fVar15) | ~uVar9 & (uint)fVar15);
      }
      uVar4 = 0;
      local_358 = ZEXT416((uint)fVar10);
      vec<1U,_float>::normalize(&local_35c,(vec<1U,_float> *)0x0);
      dVar1 = 0.0;
      dVar17 = 0.0;
      uVar11 = 0;
      while( true ) {
        fVar12 = (float)uVar11;
        fVar14 = (float)((ulong)uVar11 >> 0x20);
        if (uVar7 == uVar4) break;
        if (0.0 <= ((*vectors)[uVar4].m_s[0] - (float)local_358._0_4_) * (float)local_35c.m_s[0]) {
          dVar17 = dVar17 + (double)(*weights)[uVar4];
          uVar11 = CONCAT44(fVar14 + weightedVectors[uVar4].m_s[0],fVar12);
        }
        else {
          uVar11 = CONCAT44(fVar14,fVar12 + weightedVectors[uVar4].m_s[0]);
          dVar1 = dVar1 + (double)(*weights)[uVar4];
        }
        uVar4 = uVar4 + 1;
      }
      if (0.0 < dVar1 && 0.0 < dVar17) {
        auVar13._8_4_ = SUB84(dVar17,0);
        auVar13._0_8_ = dVar1;
        auVar13._12_4_ = (int)((ulong)dVar17 >> 0x20);
        auVar13 = divpd(_DAT_0018d190,auVar13);
        local_348 = fVar12 * (float)auVar13._0_8_;
        fStack_344 = fVar14 * (float)auVar13._8_8_;
      }
    }
    iVar3 = 0;
    fVar12 = 1e+10;
    while (iVar3 != 0x400) {
      dVar17 = 0.0;
      fVar14 = 0.0;
      fVar10 = 0.0;
      uVar5 = 0;
      uVar4 = 0;
      dVar1 = 0.0;
      for (uVar6 = 0; uVar7 != uVar6; uVar6 = uVar6 + 1) {
        fVar15 = (*vectors)[uVar6].m_s[0];
        fVar16 = local_348 - fVar15;
        fVar15 = fStack_344 - fVar15;
        if (fVar15 * fVar15 + 0.0 <= fVar16 * fVar16 + 0.0) {
          fVar10 = fVar10 + weightedVectors[uVar6].m_s[0];
          dVar1 = dVar1 + weightedDotProducts[uVar6];
          uVar4 = uVar4 + (*weights)[uVar6];
        }
        else {
          fVar14 = fVar14 + weightedVectors[uVar6].m_s[0];
          dVar17 = dVar17 + weightedDotProducts[uVar6];
          uVar5 = uVar5 + (*weights)[uVar6];
        }
      }
      if (uVar5 == 0) {
        return;
      }
      if (uVar4 == 0) {
        return;
      }
      fVar15 = (float)(dVar1 - (double)((fVar10 * fVar10) / (float)uVar4)) +
               (float)(dVar17 - (double)((fVar14 * fVar14) / (float)uVar5));
      local_348 = (1.0 / (float)uVar5) * fVar14;
      fStack_344 = (1.0 / (float)uVar4) * fVar10;
      if ((fVar15 < 1e-05) ||
         (fVar14 = fVar12 - fVar15, iVar3 = iVar3 + 1, fVar12 = fVar15, fVar14 / fVar15 < 1e-05))
      break;
    }
    (*result)[0].m_s[0] = local_348;
    (*result)[1].m_s[0] = fStack_344;
  }
  return;
}

Assistant:

void split_vectors(VectorType (&vectors)[64], uint (&weights)[64], uint size, VectorType (&result)[2])
    {
        VectorType weightedVectors[64];
        double weightedDotProducts[64];
        VectorType centroid(cClear);
        uint64 total_weight = 0;
        double ttsum = 0.0f;
        for (uint i = 0; i < size; i++)
        {
            const VectorType& v = vectors[i];
            const uint weight = weights[i];
            weightedVectors[i] = v * (float)weight;
            centroid += weightedVectors[i];
            total_weight += weight;
            weightedDotProducts[i] = v.dot(v) * weight;
            ttsum += weightedDotProducts[i];
        }
        float variance = (float)(ttsum - (centroid.dot(centroid) / total_weight));
        centroid *= (1.0f / total_weight);
        result[0] = result[1] = centroid;
        if (variance <= 0.0f || size == 1)
        {
            return;
        }
        VectorType furthest;
        double furthest_dist = -1.0f;
        for (uint i = 0; i < size; i++)
        {
            const VectorType& v = vectors[i];
            double dist = v.squared_distance(centroid);
            if (dist > furthest_dist)
            {
                furthest_dist = dist;
                furthest = v;
            }
        }
        VectorType opposite;
        double opposite_dist = -1.0f;
        for (uint i = 0; i < size; i++)
        {
            const VectorType& v = vectors[i];
            double dist = v.squared_distance(furthest);
            if (dist > opposite_dist)
            {
                opposite_dist = dist;
                opposite = v;
            }
        }
        VectorType left_child((furthest + centroid) * .5f);
        VectorType right_child((opposite + centroid) * .5f);
        if (size > 2)
        {
            const uint N = VectorType::num_elements;
            matrix<N, N, float> covar;
            covar.clear();
            for (uint i = 0; i < size; i++)
            {
                const VectorType& v = vectors[i] - centroid;
                const VectorType w = v * (float)weights[i];
                for (uint x = 0; x < N; x++)
                {
                    for (uint y = x; y < N; y++)
                    {
                        covar[x][y] = covar[x][y] + v[x] * w[y];
                    }
                }
            }
            float divider = (float)total_weight;
            for (uint x = 0; x < N; x++)
            {
                for (uint y = x; y < N; y++)
                {
                    covar[x][y] /= divider;
                    covar[y][x] = covar[x][y];
                }
            }
            VectorType axis(1.0f);
            for (uint iter = 0; iter < 10; iter++)
            {
                VectorType x;
                double max_sum = 0;
                for (uint i = 0; i < N; i++)
                {
                    double sum = 0;
                    for (uint j = 0; j < N; j++)
                    {
                        sum += axis[j] * covar[i][j];
                    }
                    x[i] = (float)sum;
                    max_sum = i ? math::maximum(max_sum, sum) : sum;
                }
                if (max_sum != 0.0f)
                {
                    x *= (float)(1.0f / max_sum);
                }
                axis = x;
            }
            axis.normalize();
            VectorType new_left_child(0.0f);
            VectorType new_right_child(0.0f);
            double left_weight = 0.0f;
            double right_weight = 0.0f;
            for (uint i = 0; i < size; i++)
            {
                const VectorType& v = vectors[i];
                const float weight = (float)weights[i];
                double t = (v - centroid) * axis;
                if (t < 0.0f)
                {
                    new_left_child += weightedVectors[i];
                    left_weight += weight;
                }
                else
                {
                    new_right_child += weightedVectors[i];
                    right_weight += weight;
                }
            }
            if ((left_weight > 0.0f) && (right_weight > 0.0f))
            {
                left_child = new_left_child * (float)(1.0f / left_weight);
                right_child = new_right_child * (float)(1.0f / right_weight);
            }
        }
        uint64 left_weight = 0;
        uint64 right_weight = 0;
        float prev_total_variance = 1e+10f;
        float left_variance = 0.0f;
        float right_variance = 0.0f;
        const uint cMaxLoops = 1024;
        for (uint total_loops = 0; total_loops < cMaxLoops; total_loops++)
        {
            VectorType new_left_child(cClear);
            VectorType new_right_child(cClear);
            double left_ttsum = 0.0f;
            double right_ttsum = 0.0f;
            left_weight = 0;
            right_weight = 0;
            for (uint i = 0; i < size; i++)
            {
                const VectorType& v = vectors[i];
                double left_dist2 = left_child.squared_distance(v);
                double right_dist2 = right_child.squared_distance(v);
                if (left_dist2 < right_dist2)
                {
                    new_left_child += weightedVectors[i];
                    left_ttsum += weightedDotProducts[i];
                    left_weight += weights[i];
                }
                else
                {
                    new_right_child += weightedVectors[i];
                    right_ttsum += weightedDotProducts[i];
                    right_weight += weights[i];
                }
            }
            if ((!left_weight) || (!right_weight))
            {
                return;
            }
            left_variance = (float)(left_ttsum - (new_left_child.dot(new_left_child) / left_weight));
            right_variance = (float)(right_ttsum - (new_right_child.dot(new_right_child) / right_weight));
            new_left_child *= (1.0f / left_weight);
            new_right_child *= (1.0f / right_weight);
            left_child = new_left_child;
            right_child = new_right_child;
            float total_variance = left_variance + right_variance;
            if (total_variance < .00001f)
            {
                break;
            }
            if (((prev_total_variance - total_variance) / total_variance) < .00001f)
            {
                break;
            }
            prev_total_variance = total_variance;
        }
        result[0] = left_child;
        result[1] = right_child;
    }